

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O2

bool xercesc_4_0::XIncludeUtils::isXIIncludeElement(XMLCh *name,XMLCh *namespaceURI)

{
  bool bVar1;
  
  if (name == (XMLCh *)0x0 || namespaceURI == (XMLCh *)0x0) {
    return false;
  }
  bVar1 = XMLString::equals(name,(XMLCh *)fgXIIncludeQName);
  if ((bVar1) && (bVar1 = XMLString::equals(namespaceURI,(XMLCh *)fgXIIIncludeNamespaceURI), bVar1))
  {
    return true;
  }
  return false;
}

Assistant:

bool
XIncludeUtils::isXIIncludeElement(const XMLCh *name, const XMLCh *namespaceURI){
    if (namespaceURI == NULL || name == NULL){
        /* no namespaces not supported */
        return false;
    }
    if (XMLString::equals(name, fgXIIncludeQName)
        && XMLString::equals(namespaceURI, fgXIIIncludeNamespaceURI)){
        return true;
    }
    return false;
}